

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O1

WriteNLResult * __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::WriteFiles
          (WriteNLResult *__return_storage_ptr__,
          NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLW2_NLFeeder_C_Impl>_> *this,
          string *namebase)

{
  pointer pcVar1;
  
  WriteAuxFiles(this,namebase);
  WriteNL(this,namebase);
  __return_storage_ptr__->first = (this->result_).first;
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  pcVar1 = (this->result_).second._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->second,pcVar1,
             pcVar1 + (this->result_).second._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

WriteNLResult NLWriter2<Params>::WriteFiles(
    const std::string& namebase) {
  WriteAuxFiles(namebase);
  WriteNL(namebase);
  return GetResult();
}